

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
               (void)

{
  pointer puVar1;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  Column_zp_settings *this;
  mapped_type *col;
  uint uVar4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *b;
  pointer witness;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  m;
  uint local_1f0 [2];
  undefined8 local_1e8;
  shared_count sStack_1e0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_1d8;
  key_type local_1c0 [2];
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_1b8;
  undefined1 local_188 [8];
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  local_180;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_178;
  Index local_140;
  Column_zp_settings *local_138;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  local_188 = (undefined1  [8])this;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
  ::
  Base_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
              *)&local_180,&local_1d8,this);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
            (&local_1d8,
             (Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
              *)local_188);
  local_1b8._M_impl._0_4_ = 2;
  if (local_140 == 3) {
    local_140 = 2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&local_178,&local_1b8);
  local_1b8._M_impl._0_4_ = 4;
  if (local_140 == 5) {
    local_140 = 4;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&local_178,&local_1b8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x341);
  local_1c0[0] = 2;
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        *)&local_178,local_1c0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x341);
  local_1f0[0] = local_1f0[0] & 0xffffff00;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1b8._M_impl._0_8_ = &PTR__lazy_ostream_001be7f0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x19716e;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x342);
  local_1c0[1] = 4;
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        *)&local_178,local_1c0 + 1);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x342);
  local_1f0[0] = local_1f0[0] & 0xffffff00;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1b8._M_impl._0_8_ = &PTR__lazy_ostream_001be7f0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x19716e;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::_M_erase(&local_1d8,
             local_1d8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::_M_erase(&local_1d8,
             local_1d8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  if (local_1d8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = 0;
    witness = local_1d8.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((uVar4 == 4) || (uVar4 == 2)) {
        uVar4 = uVar4 | 1;
      }
      local_1f0[0] = uVar4;
      col = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_178,local_1f0);
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>
                  *)&local_1b8,col);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>
                          *)&local_1b8);
      uVar4 = uVar4 + 1;
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_1b8);
      witness = witness + 1;
    } while (witness !=
             local_1d8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  auVar2 = local_188;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_178);
  auVar3 = local_188;
  local_140 = 0;
  local_138 = (Column_zp_settings *)auVar2;
  if (local_188 != (undefined1  [8])0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)((long)local_188 + 0x20));
    puVar1 = (((Field_operators *)auVar3)->inverse_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(((Field_operators *)auVar3)->inverse_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1)
      ;
    }
    operator_delete((void *)auVar3,0x58);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_178);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::~Matrix_row_access(&local_180);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_1d8);
  return;
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}